

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  unsigned_long *puVar1;
  String *pSVar2;
  Own<kj::HttpHeaders> *pOVar3;
  Own<kj::AsyncInputStream> *params;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar4;
  Own<kj::AsyncOutputStream> *other;
  void *__child_stack;
  undefined4 in_register_00000034;
  WebSocketResponseImpl *object;
  undefined4 in_register_00000084;
  __fn *in_R9;
  Maybe<unsigned_long> *in_stack_00000008;
  Own<kj::AsyncInputStream> local_218;
  undefined1 local_208 [56];
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> local_1d0;
  Promise<void> local_1c0;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> local_1b0;
  undefined1 local_1a0 [8];
  Own<kj::AsyncInputStream> wrapper;
  undefined1 local_180 [8];
  OneWayPipe pipe;
  Own<kj::(anonymous_namespace)::NullOutputStream> local_158;
  WebSocketResponseImpl *local_140;
  uint local_138;
  String local_130;
  Own<kj::HttpHeaders> local_118;
  Maybe<unsigned_long> local_108;
  Promise<void> local_f8;
  Promise<void> local_e8;
  unsigned_long local_d8 [3];
  HttpHeaders local_c0;
  undefined1 local_60 [8];
  Own<kj::HttpHeaders> headersCopy;
  String statusTextCopy;
  HttpHeaders *headers_local;
  uint statusCode_local;
  WebSocketResponseImpl *this_local;
  StringPtr statusText_local;
  
  object = (WebSocketResponseImpl *)CONCAT44(in_register_00000034,__fd);
  statusText_local.content.ptr = (char *)CONCAT44(in_register_00000084,__flags);
  this_local = (WebSocketResponseImpl *)__n;
  statusText_local.content.size_ = (size_t)this;
  str<kj::StringPtr&>((String *)&headersCopy.ptr,(kj *)&this_local,(StringPtr *)__buf);
  HttpHeaders::clone(&local_c0,in_R9,__child_stack,(int)__n,
                     (void *)CONCAT44(in_register_00000084,__flags));
  heap<kj::HttpHeaders>((kj *)local_60,&local_c0);
  HttpHeaders::~HttpHeaders(&local_c0);
  local_d8[0] = 1;
  puVar1 = Maybe<unsigned_long>::orDefault(in_stack_00000008,local_d8);
  if (*puVar1 == 0) {
    local_140 = object;
    local_138 = (uint)__buf;
    pSVar2 = mv<kj::String>((String *)&headersCopy.ptr);
    String::String(&local_130,pSVar2);
    pOVar3 = mv<kj::Own<kj::HttpHeaders>>((Own<kj::HttpHeaders> *)local_60);
    Own<kj::HttpHeaders>::Own(&local_118,pOVar3);
    Maybe<unsigned_long>::Maybe(&local_108,in_stack_00000008);
    Promise<void>::
    then<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_,kj::_::PropagateException>
              (&local_f8,(Type *)&object->task,(PropagateException *)&local_140);
    Promise<void>::
    eagerlyEvaluate<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::Exception&&)_1_>
              (&local_e8,(Type *)&local_f8);
    Promise<void>::operator=(&object->task,&local_e8);
    Promise<void>::~Promise(&local_e8);
    Promise<void>::~Promise(&local_f8);
    (anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::
    send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1}::
    ~Maybe((_lambda___1_ *)&local_140);
    heap<kj::(anonymous_namespace)::NullOutputStream>();
    Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::NullOutputStream,void>
              ((Own<kj::AsyncOutputStream> *)this,&local_158);
    Own<kj::(anonymous_namespace)::NullOutputStream>::~Own(&local_158);
    pipe.out.ptr._4_4_ = 1;
  }
  else {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)&wrapper.ptr,in_stack_00000008);
    newOneWayPipe((OneWayPipe *)local_180,(Maybe<unsigned_long> *)&wrapper.ptr);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&wrapper.ptr);
    params = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_180);
    addRef<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>
              ((kj *)&local_1d0,object);
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
              (&local_1c0,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
               &object->task);
    heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream>,kj::Promise<void>>
              ((kj *)&local_1b0,params,&local_1c0);
    Own<kj::AsyncInputStream>::
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,void>
              ((Own<kj::AsyncInputStream> *)local_1a0,&local_1b0);
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::~Own(&local_1b0);
    Promise<void>::~Promise(&local_1c0);
    Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>::~Own(&local_1d0);
    pPVar4 = Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::operator->
                       (&object->fulfiller);
    local_208._0_4_ = (uint)__buf;
    StringPtr::StringPtr((StringPtr *)(local_208 + 8),(String *)&headersCopy.ptr);
    local_208._24_8_ = Own<kj::HttpHeaders>::get((Own<kj::HttpHeaders> *)local_60);
    pOVar3 = (Own<kj::HttpHeaders> *)mv<kj::String>((String *)&headersCopy.ptr);
    mv<kj::Own<kj::HttpHeaders>>((Own<kj::HttpHeaders> *)local_60);
    Own<kj::AsyncInputStream>::attach<kj::String,kj::Own<kj::HttpHeaders>>
              (&local_218,(String *)local_1a0,pOVar3);
    OneOf<kj::Own<kj::AsyncInputStream>,kj::Own<kj::WebSocket>>::
    OneOf<kj::Own<kj::AsyncInputStream>>
              ((OneOf<kj::Own<kj::AsyncInputStream>,kj::Own<kj::WebSocket>> *)(local_208 + 0x20),
               &local_218);
    (**pPVar4->_vptr_PromiseFulfiller)(pPVar4,local_208);
    HttpClient::WebSocketResponse::~WebSocketResponse((WebSocketResponse *)local_208);
    Own<kj::AsyncInputStream>::~Own(&local_218);
    other = mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)&pipe.in.ptr);
    Own<kj::AsyncOutputStream>::Own((Own<kj::AsyncOutputStream> *)this,other);
    pipe.out.ptr._4_4_ = 1;
    Own<kj::AsyncInputStream>::~Own((Own<kj::AsyncInputStream> *)local_1a0);
    OneWayPipe::~OneWayPipe((OneWayPipe *)local_180);
  }
  Own<kj::HttpHeaders>::~Own((Own<kj::HttpHeaders> *)local_60);
  String::~String((String *)&headersCopy.ptr);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }